

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var>::dealloc
               (value_and_holder *v_h)

{
  bool bVar1;
  undefined1 local_28 [8];
  error_scope scope;
  
  error_scope::error_scope((error_scope *)local_28);
  bVar1 = pybind11::detail::value_and_holder::holder_constructed(v_h);
  if (bVar1) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v_h->vh + 2));
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,false);
  }
  else {
    pybind11::detail::call_operator_delete(*v_h->vh,v_h->type->type_size,v_h->type->type_align);
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope((error_scope *)local_28);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }